

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> * __thiscall
TextBuffer::Layer::find_words_with_subsequence_in_range
          (vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
           *__return_storage_ptr__,Layer *this,u16string *query,u16string *extra_word_characters,
          Range range)

{
  pointer pcVar1;
  iterator __position;
  u16string *puVar2;
  pointer puVar3;
  pointer pSVar4;
  pointer pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar6;
  pointer pSVar7;
  pointer pSVar8;
  wint_t wVar9;
  int iVar10;
  vector<Point,std::allocator<Point>> *this_00;
  Point PVar11;
  iterator iVar12;
  pointer pSVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  __node_base _Var17;
  pointer __x;
  SubsequenceMatchVariant *pSVar18;
  value_type *pvVar19;
  ulong uVar20;
  long lVar21;
  iterator __position_00;
  const_iterator __position_01;
  ClipResult CVar22;
  ClipResult CVar23;
  initializer_list<TextBuffer::Layer::SubsequenceMatchVariant> __l;
  vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> *matches;
  SubsequenceMatchVariant new_match;
  Point current_word_start;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  new_match_variants;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  match_variants;
  size_t query_index;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  entry;
  u16string current_word;
  u16string raw_query;
  Point position;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
  substring_matches;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_188;
  _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  int local_158;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *local_148;
  Point local_140;
  Point local_138;
  uint local_12c;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  local_128;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  local_108;
  size_t local_f0;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  local_e8;
  u16string local_b0;
  long *local_90 [2];
  long local_80 [2];
  Point local_70;
  _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_140 = range.end;
  local_f0 = 0;
  Point::Point(&local_70);
  Point::Point(&local_138);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = L'\0';
  local_90[0] = local_80;
  pcVar1 = (query->_M_dataplus)._M_p;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_90,pcVar1,pcVar1 + query->_M_string_length);
  uVar14 = query->_M_string_length;
  if (uVar14 < 0x51) {
    local_148 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                 *)extra_word_characters;
    if (uVar14 != 0) {
      pcVar1 = (query->_M_dataplus)._M_p;
      lVar21 = 0;
      do {
        wVar9 = towlower((uint)*(ushort *)((long)pcVar1 + lVar21));
        *(short *)((long)pcVar1 + lVar21) = (short)wVar9;
        lVar21 = lVar21 + 2;
      } while (uVar14 * 2 != lVar21);
    }
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    CVar22 = clip_position(this,range.start,false);
    CVar23 = clip_position(this,local_140,false);
    local_1a8._0_8_ = local_148;
    local_1a8._8_8_ = &local_b0;
    local_198._M_allocated_capacity = (size_type)&local_138;
    local_198._8_8_ = &local_70;
    local_188._M_allocated_capacity = (size_type)&local_f0;
    local_178 = &local_68;
    local_188._8_8_ = query;
    for_each_chunk_in_range<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextSlice)_1_>
              (this,CVar22.position,CVar23.position,(anon_class_56_7_63254529 *)local_1a8,false);
    if (((local_b0._M_string_length != 0) && (local_b0._M_string_length < 0x51)) &&
       (local_f0 == query->_M_string_length)) {
      this_00 = (vector<Point,std::allocator<Point>> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_68,&local_b0);
      __position._M_current = *(Point **)(this_00 + 8);
      if (__position._M_current == *(Point **)(this_00 + 0x10)) {
        std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
                  (this_00,__position,&local_138);
      }
      else {
        *__position._M_current = local_138;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_68._M_before_begin._M_nxt !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      _Var17._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
        ::pair(&local_e8,
               (pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
                *)((long)_Var17._M_nxt + 8));
        local_198._M_allocated_capacity = 0;
        local_198._8_8_ = (Point *)0x0;
        local_1a8._0_8_ = (u16string *)0x0;
        local_1a8._8_8_ = (u16string *)0x0;
        local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffff0000;
        __l._M_len = 1;
        __l._M_array = (iterator)local_1a8;
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::vector(&local_108,__l,(allocator_type *)&local_128);
        if ((u16string *)local_1a8._8_8_ != (u16string *)0x0) {
          operator_delete((void *)local_1a8._8_8_,local_198._8_8_ - local_1a8._8_8_);
        }
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                     *)_Var17._M_nxt;
        if (local_e8.first._M_string_length == 0) {
          uVar14 = 0;
        }
        else {
          uVar20 = 0;
          do {
            wVar9 = towlower((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar20]);
            if (local_108.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_108.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_140 = (Point)(uVar20 - 1);
              pSVar13 = local_108.
                        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __position_00._M_current =
                   local_108.
                   super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              do {
                puVar2 = (u16string *)(__position_00._M_current)->query_index;
                if (puVar2 < (u16string *)query->_M_string_length) {
                  if ((query->_M_dataplus)._M_p[(long)puVar2] == (char16_t)wVar9) {
                    local_1a8._0_8_ = puVar2;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (local_1a8 + 8),&(__position_00._M_current)->match_indices);
                    local_1a8._0_8_ = local_1a8._0_8_ + 1;
                    local_188._M_local_buf[0] = (__position_00._M_current)->score;
                    if (((uVar20 == 0) ||
                        (iVar10 = iswalnum((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar20 - 1]
                                          ), iVar10 == 0)) ||
                       ((iVar10 = iswlower((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar20 - 1]
                                          ), iVar10 != 0 &&
                        (iVar10 = iswupper((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar20]),
                        iVar10 != 0)))) {
                      local_188._M_local_buf[0] =
                           (ushort)(local_e8.first._M_dataplus._M_p[uVar20] ==
                                   *(char16_t *)
                                    ((long)local_90[0] + (__position_00._M_current)->query_index * 2
                                    )) + local_188._M_local_buf[0] + 9;
                    }
                    if ((local_1a8._8_8_ != local_198._M_allocated_capacity) &&
                       (PVar11.column = 0,
                       PVar11.row = *(uint *)(local_198._M_allocated_capacity - 4),
                       local_140 == PVar11)) {
                      local_188._M_local_buf[0] = local_188._M_local_buf[0] + L'\x05';
                    }
                    local_12c = (uint)uVar20;
                    if (local_198._M_allocated_capacity == local_198._8_8_) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (local_1a8 + 8),(iterator)local_198._M_allocated_capacity,
                                 &local_12c);
                    }
                    else {
                      *(uint *)local_198._M_allocated_capacity = local_12c;
                      local_198._M_allocated_capacity = local_198._M_allocated_capacity + 4;
                    }
                    std::
                    vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ::push_back(&local_128,(value_type *)local_1a8);
                    if ((u16string *)local_1a8._8_8_ != (u16string *)0x0) {
                      operator_delete((void *)local_1a8._8_8_,local_198._8_8_ - local_1a8._8_8_);
                    }
                  }
                  (__position_00._M_current)->score =
                       (__position_00._M_current)->score + ((uVar20 < 3) - 1 | 0xfffd);
                  iVar12._M_current = __position_00._M_current + 1;
                  if (iVar12._M_current ==
                      local_108.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                  pSVar13 = local_108.
                            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position_00._M_current[1].query_index ==
                      (__position_00._M_current)->query_index) {
                    iVar12 = std::
                             vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                             ::_M_erase(&local_108,__position_00);
                    pSVar13 = local_108.
                              super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                else {
                  iVar12._M_current = __position_00._M_current + 1;
                }
                __position_00._M_current = iVar12._M_current;
              } while (iVar12._M_current != pSVar13);
            }
            pSVar13 = local_128.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __x = local_128.
                  super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            if (local_128.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_128.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                __position_01._M_current =
                     local_108.
                     super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (0 < (long)local_108.
                              super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_108.
                              super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                              ._M_impl.super__Vector_impl_data._M_start) {
                  uVar14 = ((ulong)((long)local_108.
                                          super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_108.
                                         super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x3333333333333333;
                  do {
                    uVar15 = uVar14 >> 1;
                    uVar16 = uVar15;
                    if (__position_01._M_current[uVar15].query_index < __x->query_index) {
                      uVar16 = ~uVar15 + uVar14;
                      __position_01._M_current = __position_01._M_current + uVar15 + 1;
                    }
                    uVar14 = uVar16;
                  } while (0 < (long)uVar16);
                }
                if (((__position_01._M_current ==
                      local_108.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_finish) ||
                    (__x->query_index != (__position_01._M_current)->query_index)) ||
                   (__x->score < (__position_01._M_current)->score)) {
                  std::
                  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  ::insert(&local_108,__position_01,__x);
                }
                else {
                  (__position_01._M_current)->query_index = __x->query_index;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                            (&(__position_01._M_current)->match_indices,&__x->match_indices);
                  (__position_01._M_current)->score = __x->score;
                }
                pSVar8 = local_128.
                         super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pSVar7 = local_128.
                         super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                __x = __x + 1;
              } while (__x != pSVar13);
              pvVar19 = local_128.
                        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_128.
                  super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_128.
                  super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                do {
                  puVar3 = (pvVar19->match_indices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if (puVar3 != (pointer)0x0) {
                    operator_delete(puVar3,(long)(pvVar19->match_indices).
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           - (long)puVar3);
                  }
                  pvVar19 = pvVar19 + 1;
                } while (pvVar19 != pSVar8);
                local_128.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
              }
            }
            uVar20 = uVar20 + 1;
            uVar14 = local_e8.first._M_string_length;
          } while (uVar20 < local_e8.first._M_string_length);
        }
        if (local_108.
            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_108.
            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar18 = (SubsequenceMatchVariant *)0x0;
        }
        else {
          pSVar18 = (SubsequenceMatchVariant *)0x0;
          pSVar13 = local_108.
                    super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if ((pSVar13->query_index == query->_M_string_length) &&
               ((pSVar18 == (SubsequenceMatchVariant *)0x0 || (pSVar18->score < pSVar13->score)))) {
              pSVar18 = pSVar13;
            }
            pSVar13 = pSVar13 + 1;
          } while (pSVar13 !=
                   local_108.
                   super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_1a8._0_8_ = &local_198;
        std::__cxx11::u16string::_M_construct<char16_t*>
                  ((u16string *)local_1a8,local_e8.first._M_dataplus._M_p,
                   local_e8.first._M_dataplus._M_p + uVar14);
        std::vector<Point,_std::allocator<Point>_>::vector
                  ((vector<Point,_std::allocator<Point>_> *)&local_188,&local_e8.second);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_170,&pSVar18->match_indices);
        local_158 = (int)pSVar18->score;
        std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
        emplace_back<TextBuffer::SubsequenceMatch>
                  (__return_storage_ptr__,(SubsequenceMatch *)local_1a8);
        paVar6 = local_148;
        if (local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_170.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((size_t *)local_188._M_allocated_capacity != (size_t *)0x0) {
          operator_delete((void *)local_188._M_allocated_capacity,(long)local_178 - local_188._0_8_)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity * 2 + 2);
        }
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::~vector(&local_128);
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::~vector(&local_108);
        if (local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
          operator_delete(local_e8.first._M_dataplus._M_p,
                          local_e8.first.field_2._M_allocated_capacity * 2 + 2);
        }
        _Var17._M_nxt = (_Hash_node_base *)paVar6->_M_allocated_capacity;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                *)_Var17._M_nxt !=
               (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                *)0x0);
      pSVar4 = (__return_storage_ptr__->
               super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (__return_storage_ptr__->
               super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar4 != pSVar5) {
        uVar14 = ((long)pSVar5 - (long)pSVar4 >> 3) * 0x2e8ba2e8ba2e8ba3;
        lVar21 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>>
                  (pSVar4,pSVar5,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,__gnu_cxx::__ops::_Iter_comp_iter<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>>
                  (pSVar4,pSVar5);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                             local_b0.field_2._M_local_buf[0]) * 2 + 2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SubsequenceMatch> find_words_with_subsequence_in_range(u16string query, const u16string &extra_word_characters, Range range) {
    const size_t MAX_WORD_LENGTH = 80;
    size_t query_index = 0;
    Point position;
    Point current_word_start;
    u16string current_word;
    u16string raw_query = query;

    if (query.size() > MAX_WORD_LENGTH) return vector<SubsequenceMatch>{};

    std::transform(query.begin(), query.end(), query.begin(), std::towlower);

    // First, find the start position of all words matching the given
    // subsequence.
    std::unordered_map<u16string, vector<Point>> substring_matches;

    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&] (TextSlice chunk) -> bool {
        for (uint16_t c : chunk) {
          bool is_word_character =
            std::iswalnum(c) ||
            std::find(extra_word_characters.begin(), extra_word_characters.end(), c) != extra_word_characters.end();

          if (is_word_character) {
            if (current_word.empty()) current_word_start = position;
            current_word += c;
            if (query_index < query.size() && towlower(c) == query[query_index]) {
              query_index++;
            }
          } else {
            if (!current_word.empty()) {
              if (query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
                substring_matches[current_word].push_back(current_word_start);
              }
              query_index = 0;
              current_word.clear();
            }
          }

          if (c == '\n') {
            position.row++;
            position.column = 0;
          } else {
            position.column++;
          }
        }

        return false;
      });

    if (!current_word.empty() && query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
      substring_matches[current_word].push_back(current_word_start);
    }

    // Next, calculate a score for each word indicating the quality of the
    // match against the query.

    static const unsigned consecutive_bonus = 5;
    static const unsigned subword_start_with_case_match_bonus = 10;
    static const unsigned subword_start_with_case_mismatch_bonus = 9;
    static const unsigned mismatch_penalty = 1;
    static const unsigned leading_mismatch_penalty = 3;

    vector<SubsequenceMatch> matches;

    for (auto entry : substring_matches) {
      const u16string &word = entry.first;
      const vector<Point> &start_positions = entry.second;

      vector<SubsequenceMatchVariant> match_variants {{}};
      vector<SubsequenceMatchVariant> new_match_variants;

      for (size_t i = 0; i < word.size(); i++) {
        uint16_t c = towlower(word[i]);

        for (auto match_variant = match_variants.begin(); match_variant != match_variants.end();) {
          if (match_variant->query_index < query.size()) {
            // If the current word character matches the next character of
            // the query for this match variant, create a *new* match variant
            // that consumes the matching character.
            if (c == query[match_variant->query_index]) {
              SubsequenceMatchVariant new_match = *match_variant;
              new_match.query_index++;

              if (i == 0 ||
                  !std::iswalnum(word[i - 1]) ||
                  (std::iswlower(word[i - 1]) && std::iswupper(word[i]))) {
                new_match.score += word[i] == raw_query[match_variant->query_index]
                  ? subword_start_with_case_match_bonus
                  : subword_start_with_case_mismatch_bonus;
              }

              if (!new_match.match_indices.empty() && new_match.match_indices.back() == i - 1) {
                new_match.score += consecutive_bonus;
              }

              new_match.match_indices.push_back(i);
              new_match_variants.push_back(new_match);
            }

            // For the current match variant, treat the current character as
            // a mismatch regardless of whether it matched above. This
            // reserves the chance for the next character to be consumed by a
            // match with higher overall value.
            if (i < 3) {
              match_variant->score -= leading_mismatch_penalty;
            } else {
              match_variant->score -= mismatch_penalty;
            }

            // If a match variant does *not* match the current character (and is therefore
            // ineligible for the consecutive match bonus on the next character), its
            // potential for future scoring is determined entirely by its `query_index`.
            //
            // These match variants are ordered by ascending `query_index`. If multiple
            // match variants have the same `query_index`, they are ordered by ascending
            // `score`.
            //
            // If there is another match variant with the same `query_index` and a greater
            // or equal `score`, discard the current match variant.
            auto next_match_variant = match_variant + 1;
            if (next_match_variant != match_variants.end() && next_match_variant->query_index == match_variant->query_index) {
              match_variant = match_variants.erase(match_variant);
            } else {
              ++match_variant;
            }
          } else {
            ++match_variant;
          }
        }

        // Add all of the newly-computed match variants to the list. Avoid creating duplicate
        // match variants with the same query index unless the new variant (which is
        // by definition eligible for the consecutive match bonus on the next character) has
        // a lower score than an existing variant. Maintain the invariant that match variants
        // are ordered by ascending `query_index` and ascending `score`.
        for (const SubsequenceMatchVariant &new_variant : new_match_variants) {
          auto existing_match_iter = std::lower_bound(match_variants.begin(), match_variants.end(), new_variant);
          if (existing_match_iter != match_variants.end() && new_variant.query_index == existing_match_iter->query_index) {
            if (new_variant.score >= existing_match_iter->score) {
              *existing_match_iter = new_variant;
              continue;
            }
          }
          match_variants.insert(existing_match_iter, new_variant);
        }
        new_match_variants.clear();
      }

      SubsequenceMatchVariant *best_match = nullptr;
      for (auto &match_variant : match_variants) {
        if (match_variant.query_index == query.size()) {
          if (!best_match || best_match->score < match_variant.score) {
            best_match = &match_variant;
          }
        }
      }

      matches.push_back(SubsequenceMatch{word, start_positions, best_match->match_indices, best_match->score});
    }

    std::sort(matches.begin(), matches.end(), [] (const SubsequenceMatch &a, const SubsequenceMatch &b) {
      // Doing it this way helps us avoid sorting ambiguity keeping the ordering the same across platforms.
      if (a.score > b.score) return true;
      if (b.score > a.score) return false;
      return a.word < b.word;
    });

    return matches;
  }